

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

asn_enc_rval_t *
OCTET_STRING_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  asn_per_constraint_flags aVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  asn_OCTET_STRING_specifics_t *paVar5;
  ulong units;
  ssize_t sVar6;
  ulong uVar7;
  uint32_t bits;
  uint uVar8;
  uint8_t *buf;
  asn_per_constraint_s *paVar9;
  uint local_5c;
  uint local_58;
  asn_per_constraints_t *local_48;
  
  paVar5 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar5 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  if ((sptr == (void *)0x0) || ((*sptr == 0 && (*(int *)((long)sptr + 8) != 0)))) {
LAB_001476b3:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
    return __return_storage_ptr__;
  }
  local_48 = constraints;
  if (constraints == (asn_per_constraints_t *)0x0) {
    local_48 = &asn_DEF_OCTET_STRING_constraints;
  }
  paVar9 = &local_48->size;
  if (3 < paVar5->subvariant - ASN_OSUBV_BIT) goto LAB_001476b3;
  aVar1 = (local_48->size).flags;
  switch(paVar5->subvariant) {
  case ASN_OSUBV_BIT:
    uVar3 = *(int *)((long)sptr + 8) * 8 - (*(uint *)((long)sptr + 0xc) & 7);
    local_58 = 0;
    bVar2 = true;
    uVar8 = 1;
    local_5c = uVar8;
    goto LAB_0014772d;
  case ASN_OSUBV_STR:
    uVar8 = 8;
    local_5c = uVar8;
    if (((local_48->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_5c = (local_48->value).range_bits;
    }
    local_58 = 1;
    uVar3 = *(uint *)((long)sptr + 8);
    goto LAB_00147725;
  case ASN_OSUBV_U16:
    uVar8 = 0x10;
    local_5c = uVar8;
    if (((local_48->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_5c = (local_48->value).range_bits;
    }
    iVar4 = *(int *)((long)sptr + 8);
    local_58 = 2;
    break;
  case ASN_OSUBV_U32:
    uVar8 = 0x20;
    local_5c = uVar8;
    if (((local_48->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_5c = (local_48->value).range_bits;
    }
    iVar4 = *(int *)((long)sptr + 8);
    local_58 = 4;
  }
  uVar3 = iVar4 / (int)local_58;
LAB_00147725:
  bVar2 = false;
LAB_0014772d:
  iVar4 = paVar9->effective_bits;
  if ((iVar4 < 0) ||
     ((paVar9->lower_bound <= (long)(int)uVar3 && ((long)(int)uVar3 <= paVar9->upper_bound)))) {
    bits = 0;
    if ((aVar1 & APC_EXTENSIBLE) != APC_UNCONSTRAINED) goto LAB_00147764;
LAB_0014777d:
    if (iVar4 < 0) {
      if (uVar3 != 0) {
        buf = *sptr;
        for (; uVar3 != 0; uVar3 = uVar3 - (int)units) {
          units = uper_put_length(po,(ulong)uVar3);
          if ((long)units < 0) {
LAB_0014788c:
            __return_storage_ptr__->encoded = -1;
            __return_storage_ptr__->failed_type = td;
            goto LAB_001477a7;
          }
          if (bVar2) {
            iVar4 = per_put_many_bits(po,buf,local_5c * (int)units);
          }
          else {
            iVar4 = OCTET_STRING_per_put_characters
                              (po,buf,units,local_58,local_5c,(local_48->value).lower_bound,
                               (local_48->value).upper_bound,constraints);
          }
          if (iVar4 != 0) goto LAB_0014788c;
          uVar7 = units >> 3;
          if (!bVar2) {
            uVar7 = units * local_58;
          }
          buf = buf + uVar7;
        }
LAB_001478eb:
        __return_storage_ptr__->encoded = 0;
        __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
        __return_storage_ptr__->structure_ptr = (void *)0x0;
        return __return_storage_ptr__;
      }
      sVar6 = uper_put_length(po,0);
      if (sVar6 == 0) goto LAB_001478eb;
    }
    else {
      iVar4 = per_put_few_bits(po,uVar3 - (int)paVar9->lower_bound,iVar4);
      if (iVar4 == 0) {
        if (bVar2) {
          iVar4 = per_put_many_bits(po,*sptr,local_5c * uVar3);
        }
        else {
          iVar4 = OCTET_STRING_per_put_characters
                            (po,*sptr,(ulong)uVar3,local_58,local_5c,(local_48->value).lower_bound,
                             (local_48->value).upper_bound,constraints);
        }
        if (iVar4 == 0) goto LAB_001478eb;
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        goto LAB_001477a7;
      }
    }
  }
  else if ((aVar1 & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
    bits = 1;
    local_48 = &asn_DEF_OCTET_STRING_constraints;
    paVar9 = &asn_DEF_OCTET_STRING_constraints.size;
    local_5c = uVar8;
LAB_00147764:
    iVar4 = per_put_few_bits(po,bits,1);
    if (iVar4 == 0) {
      iVar4 = paVar9->effective_bits;
      goto LAB_0014777d;
    }
  }
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
LAB_001477a7:
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_uper(asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	asn_enc_rval_t er = { 0, 0, 0 };
	int inext = 0;		/* Lies not within extension root */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;
	unsigned int sizeinunits;
	const uint8_t *buf;
	int ret;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	int ct_extensible;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}
	ct_extensible = csiz->flags & APC_EXTENSIBLE;

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN__ENCODE_FAILED;
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		sizeinunits = st->size * 8 - (st->bits_unused & 0x07);
		ASN_DEBUG("BIT STRING of %d bytes, %d bits unused",
				sizeinunits, st->bits_unused);
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		sizeinunits = st->size;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		sizeinunits = st->size / 2;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		sizeinunits = st->size / 4;
		break;
	}

	ASN_DEBUG("Encoding %s into %d units of %d bits"
		" (%ld..%ld, effective %d)%s",
		td->name, sizeinunits, unit_bits,
		csiz->lower_bound, csiz->upper_bound,
		csiz->effective_bits, ct_extensible ? " EXT" : "");

	/* Figure out whether size lies within PER visible constraint */

	if(csiz->effective_bits >= 0) {
		if((int)sizeinunits < csiz->lower_bound
		|| (int)sizeinunits > csiz->upper_bound) {
			if(ct_extensible) {
				cval = &asn_DEF_OCTET_STRING_constraints.value;
				csiz = &asn_DEF_OCTET_STRING_constraints.size;
				unit_bits = canonical_unit_bits;
				inext = 1;
			} else
				ASN__ENCODE_FAILED;
		}
	} else {
		inext = 0;
	}

	if(ct_extensible) {
		/* Declare whether length is [not] within extension root */
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits >= 0) {
		ASN_DEBUG("Encoding %d bytes (%ld), length in %d bits",
				st->size, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		ret = per_put_few_bits(po, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		if(ret) ASN__ENCODE_FAILED;
		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, st->buf,
				sizeinunits, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, st->buf,
				sizeinunits * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	ASN_DEBUG("Encoding %d bytes", st->size);

	if(sizeinunits == 0) {
		if(uper_put_length(po, 0))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	buf = st->buf;
	while(sizeinunits) {
		ssize_t maySave = uper_put_length(po, sizeinunits);
		if(maySave < 0) ASN__ENCODE_FAILED;

		ASN_DEBUG("Encoding %ld of %ld",
			(long)maySave, (long)sizeinunits);

		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, buf,
				maySave, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, buf, maySave * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;

		if(bpc)
			buf += maySave * bpc;
		else
			buf += maySave >> 3;
		sizeinunits -= maySave;
		assert(!(maySave & 0x07) || !sizeinunits);
	}

	ASN__ENCODED_OK(er);
}